

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.2.4.11.h
# Opt level: O0

MessageBuilder * __thiscall
doctest::detail::MessageBuilder::operator_(MessageBuilder *this,char (*in) [64])

{
  MessageBuilder *in_RDI;
  String *in_stack_ffffffffffffffa8;
  
  toString<char[64],_true>((char (*) [64])in_stack_ffffffffffffffa8);
  doctest::operator<<((ostream *)in_RDI,in_stack_ffffffffffffffa8);
  String::~String((String *)in_RDI);
  return in_RDI;
}

Assistant:

MessageBuilder& operator,(const T& in) {
            *m_stream << (DOCTEST_STRINGIFY(in));
            return *this;
        }